

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

bool __thiscall AixLog::Filter::match(Filter *this,Metadata *metadata)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  Tag local_50;
  
  if ((this->tag_filter_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    bVar1 = true;
  }
  else {
    cVar2 = std::
            _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
            ::find((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
                    *)this,&metadata->tag);
    cVar3 = cVar2;
    if ((_Rb_tree_header *)cVar2._M_node == &(this->tag_filter_)._M_t._M_impl.super__Rb_tree_header)
    {
      Tag::Tag(&local_50,"*");
      cVar3 = std::
              _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
              ::find((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
                      *)this,&local_50);
      Tag::~Tag(&local_50);
      if (cVar3._M_node == cVar2._M_node) {
        return false;
      }
    }
    bVar1 = *(char *)&cVar3._M_node[2]._M_left <= (char)metadata->severity;
  }
  return bVar1;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Timestamp& timestamp) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.timestamp = timestamp;
  } else if (timestamp) {
    os << timestamp.to_string();
  }
  return os;
}